

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

iterator * __thiscall pybind11::detail::values_and_holders::iterator::operator++(iterator *this)

{
  reference pptVar1;
  __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
  *this_00;
  iterator *this_local;
  
  if (((byte)this->inst->field_0x30 >> 1 & 1) == 0) {
    pptVar1 = __gnu_cxx::
              __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
              ::operator*(&this->typeit);
    (this->curr).vh = (this->curr).vh + (*pptVar1)->holder_size_in_ptrs + 1;
    this_00 = __gnu_cxx::
              __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
              ::operator++(&this->typeit);
    pptVar1 = __gnu_cxx::
              __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
              ::operator*(this_00);
    (this->curr).type = *pptVar1;
  }
  (this->curr).index = (this->curr).index + 1;
  return this;
}

Assistant:

iterator &operator++() {
            if (!inst->simple_layout) {
                curr.vh += 1 + (*typeit)->holder_size_in_ptrs;
                curr.type = *(++typeit);
            }
            ++curr.index;
            return *this;
        }